

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O0

BOOL __thiscall
Js::JavascriptProxy::GetDiagTypeString
          (JavascriptProxy *this,StringBuilder<Memory::ArenaAllocator> *stringBuilder,
          ScriptContext *requestContext)

{
  bool bVar1;
  JavascriptProxy *this_00;
  ScriptContext *pSVar2;
  ThreadContext *this_01;
  RecyclableObject *pRVar3;
  ThreadContext *threadContext;
  JavascriptProxy *proxy;
  ScriptContext *requestContext_local;
  StringBuilder<Memory::ArenaAllocator> *stringBuilder_local;
  JavascriptProxy *this_local;
  
  this_00 = UnwrapNestedProxies(this);
  bVar1 = IsRevoked(this_00);
  if (bVar1) {
    pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
    this_01 = ScriptContext::GetThreadContext(pSVar2);
    bVar1 = ThreadContext::RecordImplicitException(this_01);
    if (bVar1) {
      pSVar2 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
      JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea15,L"getTypeString");
    }
    this_local._4_4_ = 0;
  }
  else {
    pRVar3 = Memory::WriteBarrierPtr<Js::RecyclableObject>::operator->(&this_00->target);
    this_local._4_4_ =
         (*(pRVar3->super_FinalizableObject).super_IRecyclerVisitedObject.
           _vptr_IRecyclerVisitedObject[0x51])(pRVar3,stringBuilder,requestContext);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptProxy::GetDiagTypeString(StringBuilder<ArenaAllocator>* stringBuilder, ScriptContext* requestContext)
    {
        const JavascriptProxy* proxy = UnwrapNestedProxies(this);

        //RecyclableObject* targetObj;
        if (proxy->IsRevoked())
        {
            ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("getTypeString"));
        }
        return proxy->target->GetDiagTypeString(stringBuilder, requestContext);
    }